

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O3

void __thiscall BSDFSampling_Lambertian_Test::TestBody(BSDFSampling_Lambertian_Test *this)

{
  function<pbrt::BSDF_*(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>)>
  local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object = createLambertian;
  local_28._M_invoker =
       std::
       _Function_handler<pbrt::BSDF_*(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>),_pbrt::BSDF_*(*)(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>)>
       ::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::
       _Function_handler<pbrt::BSDF_*(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>),_pbrt::BSDF_*(*)(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>)>
       ::_M_manager;
  TestBSDF(&local_28,"Lambertian");
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return;
}

Assistant:

TEST(BSDFSampling, Lambertian) {
    TestBSDF(createLambertian, "Lambertian");
}